

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslScanContext.cpp
# Opt level: O3

TBuiltInVariable __thiscall
glslang::HlslScanContext::mapSemantic(HlslScanContext *this,char *upperCase)

{
  char cVar1;
  __node_ptr p_Var2;
  key_type *__key;
  char *pcVar3;
  TBuiltInVariable TVar4;
  
  cVar1 = *upperCase;
  if (cVar1 == '\0') {
    __key = (key_type *)0x1505;
  }
  else {
    pcVar3 = upperCase + 1;
    __key = (key_type *)0x1505;
    do {
      __key = (key_type *)((long)cVar1 + (long)__key * 0x21);
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  TVar4 = EbvNone;
  p_Var2 = std::
           _Hashtable<const_char_*,_std::pair<const_char_*const,_glslang::TBuiltInVariable>,_std::allocator<std::pair<const_char_*const,_glslang::TBuiltInVariable>_>,_std::__detail::_Select1st,_(anonymous_namespace)::str_eq,_(anonymous_namespace)::str_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<const_char_*,_std::pair<const_char_*const,_glslang::TBuiltInVariable>,_std::allocator<std::pair<const_char_*const,_glslang::TBuiltInVariable>_>,_std::__detail::_Select1st,_(anonymous_namespace)::str_eq,_(anonymous_namespace)::str_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)((ulong)__key % DAT_009a0cd8),(size_type)upperCase,__key,
                          (__hash_code)__key);
  if (p_Var2 != (__node_ptr)0x0) {
    TVar4 = *(TBuiltInVariable *)
             ((long)&(p_Var2->
                     super__Hash_node_value<std::pair<const_char_*const,_glslang::TBuiltInVariable>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_char_*const,_glslang::TBuiltInVariable>_>
                     ._M_storage._M_storage + 8);
  }
  return TVar4;
}

Assistant:

size_t operator()(const char* str) const
    {
        // djb2
        unsigned long hash = 5381;
        int c;

        while ((c = *str++) != 0)
            hash = ((hash << 5) + hash) + c;

        return hash;
    }